

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void copyPrintSslCertificate(X509 *cert0)

{
  X509Cert copyCert;
  X509Cert cert;
  Array<char,_axl::sl::ArrayDetails<char>_> buffer;
  String string;
  Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> local_50;
  Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> local_48;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_40;
  StringRef local_28;
  
  axl::cry::X509Cert::X509Cert((X509Cert *)&local_48,cert0);
  local_50.m_h = (X509 *)0x0;
  axl::cry::X509Cert::saveDer
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_40,(X509Cert *)&local_48);
  axl::cry::X509Cert::loadDer((X509Cert *)&local_50,local_40.m_p,local_40.m_count);
  puts("DER-copy:");
  printSslCertificate(local_50.m_h);
  axl::cry::X509Cert::savePem((String *)&local_28,(X509Cert *)&local_48);
  axl::cry::X509Cert::loadPem((X509Cert *)&local_50,&local_28);
  puts("PEM-copy:");
  printSslCertificate(local_50.m_h);
  local_48.m_h = (x509_st *)0x0;
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_28);
  axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::~ArrayRef(&local_40);
  axl::sl::Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>::~Handle(&local_50);
  axl::sl::Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>::~Handle(&local_48);
  return;
}

Assistant:

void
copyPrintSslCertificate(X509* cert0) {
	cry::X509Cert cert = cert0;
	cry::X509Cert copyCert;

	sl::Array<char> buffer = cert.saveDer();
	copyCert.loadDer(buffer, buffer.getCount());
	printf("DER-copy:\n");
	printSslCertificate(copyCert);

	sl::String string = cert.savePem();
	copyCert.loadPem(string);
	printf("PEM-copy:\n");
	printSslCertificate(copyCert);

	cert.detach();
}